

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O1

void __thiscall cmLoadCacheCommand::CheckLine(cmLoadCacheCommand *this,char *line)

{
  cmMakefile *this_00;
  bool bVar1;
  iterator iVar2;
  CacheEntryType type;
  string var;
  string value;
  allocator local_95;
  CacheEntryType local_94;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_94 = UNINITIALIZED;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::string((string *)&local_70,line,&local_95);
  bVar1 = cmake::ParseCacheEntry(&local_70,&local_90,&local_50,&local_94);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->VariablesToRead)._M_t,&local_90);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->VariablesToRead)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_70,&this->Prefix,&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      this_00 = (this->super_cmCommand).Makefile;
      if (local_50._M_string_length == 0) {
        cmMakefile::RemoveDefinition(this_00,&local_90);
      }
      else {
        cmMakefile::AddDefinition(this_00,&local_90,local_50._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmLoadCacheCommand::CheckLine(const char* line)
{
  // Check one line of the cache file.
  std::string var;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
  if (cmake::ParseCacheEntry(line, var, value, type)) {
    // Found a real entry.  See if this one was requested.
    if (this->VariablesToRead.find(var) != this->VariablesToRead.end()) {
      // This was requested.  Set this variable locally with the given
      // prefix.
      var = this->Prefix + var;
      if (!value.empty()) {
        this->Makefile->AddDefinition(var, value.c_str());
      } else {
        this->Makefile->RemoveDefinition(var);
      }
    }
  }
}